

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::reporters::Reporter_testCompositeReporter_Test::~Reporter_testCompositeReporter_Test
          (Reporter_testCompositeReporter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Reporter, testCompositeReporter)
{
    std::vector<std::shared_ptr<Reporter>> reporters;
    reporters.push_back(std::make_shared<InMemoryReporter>());
    reporters.push_back(std::make_shared<InMemoryReporter>());

    CompositeReporter reporter(reporters);
    reporter.report(span);
    ASSERT_EQ(1,
              std::static_pointer_cast<InMemoryReporter>(reporters[0])
                  ->spansSubmitted());
    ASSERT_EQ(1,
              std::static_pointer_cast<InMemoryReporter>(reporters[1])
                  ->spansSubmitted());
}